

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_setbyhandle(HSQUIRRELVM v,SQInteger idx,HSQMEMBERHANDLE *handle)

{
  SQRESULT SVar1;
  SQObjectPtr *local_40;
  SQObjectPtr *val;
  SQObjectPtr *newval;
  SQObjectPtr *self;
  HSQMEMBERHANDLE *handle_local;
  SQInteger idx_local;
  HSQUIRRELVM v_local;
  
  self = (SQObjectPtr *)handle;
  handle_local = (HSQMEMBERHANDLE *)idx;
  idx_local = (SQInteger)v;
  newval = stack_get(v,idx);
  val = stack_get((HSQUIRRELVM)idx_local,-1);
  local_40 = (SQObjectPtr *)0x0;
  SVar1 = _getmemberbyhandle((HSQUIRRELVM)idx_local,newval,(HSQMEMBERHANDLE *)self,&local_40);
  if (SVar1 < 0) {
    v_local = (HSQUIRRELVM)0xffffffffffffffff;
  }
  else {
    SQObjectPtr::operator=(local_40,val);
    SQVM::Pop((SQVM *)idx_local);
    v_local = (HSQUIRRELVM)0x0;
  }
  return (SQRESULT)v_local;
}

Assistant:

SQRESULT sq_setbyhandle(HSQUIRRELVM v,SQInteger idx,const HSQMEMBERHANDLE *handle)
{
    SQObjectPtr &self = stack_get(v,idx);
    SQObjectPtr &newval = stack_get(v,-1);
    SQObjectPtr *val = NULL;
    if(SQ_FAILED(_getmemberbyhandle(v,self,handle,val))) {
        return SQ_ERROR;
    }
    *val = newval;
    v->Pop();
    return SQ_OK;
}